

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tenor.cpp
# Opt level: O0

Tenor * bidfx_public_api::Tenor::GetTenorFromString(string *tenor)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *ppTVar3;
  ostream *poVar4;
  invalid_argument *this;
  string local_1c8 [48];
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  string *local_10;
  string *tenor_local;
  
  local_10 = tenor;
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                   *)tenor_list__abi_cxx11_);
  if (bVar1) {
    CreateTenorList();
  }
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                   *)tenor_list__abi_cxx11_,local_10);
  if (sVar2 == 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    poVar4 = std::operator<<(local_188,"Tenor ");
    poVar4 = std::operator<<(poVar4,(string *)local_10);
    poVar4 = std::operator<<(poVar4," does not exist");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::invalid_argument::invalid_argument(this,local_1c8);
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  ppTVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,local_10);
  return *ppTVar3;
}

Assistant:

const Tenor& Tenor::GetTenorFromString(const std::string &tenor)
{
    if (tenor_list_.empty())
    {
        CreateTenorList();
    }

    if (tenor_list_.count(tenor))
    {
        return *tenor_list_[tenor];
    }

    std::stringstream ss;
    ss << "Tenor " << tenor << " does not exist" << std::endl;
    throw std::invalid_argument(ss.str());
}